

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O0

void __thiscall Matrix::operator=(Matrix *this,double d)

{
  int local_1c;
  int i;
  double d_local;
  Matrix *this_local;
  
  for (local_1c = 0; local_1c < this->nData; local_1c = local_1c + 1) {
    this->pData[local_1c] = d;
  }
  return;
}

Assistant:

void Matrix::operator=(double d)
{
    for(int i=0; i<nData; i++)
        pData[i] = d;
}